

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_intra_inter_context(MACROBLOCKD *xd)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long in_RDI;
  int left_intra;
  int above_intra;
  int has_left;
  int has_above;
  MB_MODE_INFO *left_mbmi;
  MB_MODE_INFO *above_mbmi;
  MB_MODE_INFO *in_stack_ffffffffffffffc0;
  MB_MODE_INFO *mbmi;
  bool local_35;
  uint local_34;
  uint local_4;
  
  mbmi = *(MB_MODE_INFO **)(in_RDI + 0x1ec8);
  bVar1 = *(byte *)(in_RDI + 0x1ec0) & 1;
  bVar2 = *(byte *)(in_RDI + 0x1ec1) & 1;
  if ((bVar1 == 0) || (bVar2 == 0)) {
    if ((bVar1 == 0) && (bVar2 == 0)) {
      local_4 = 0;
    }
    else {
      if (bVar1 != 0) {
        mbmi = *(MB_MODE_INFO **)(in_RDI + 0x1ed0);
      }
      iVar3 = is_inter_block(mbmi);
      local_4 = (uint)((iVar3 != 0 ^ 0xffU) & 1) << 1;
    }
  }
  else {
    iVar3 = is_inter_block(in_stack_ffffffffffffffc0);
    iVar4 = is_inter_block(in_stack_ffffffffffffffc0);
    if ((iVar4 != 0) || (iVar3 != 0)) {
      local_35 = iVar4 == 0 || iVar3 == 0;
      local_34 = (uint)local_35;
    }
    else {
      local_34 = 3;
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

int av1_get_intra_inter_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int has_above = xd->up_available;
  const int has_left = xd->left_available;

  if (has_above && has_left) {  // both edges available
    const int above_intra = !is_inter_block(above_mbmi);
    const int left_intra = !is_inter_block(left_mbmi);
    return left_intra && above_intra ? 3 : left_intra || above_intra;
  } else if (has_above || has_left) {  // one edge available
    return 2 * !is_inter_block(has_above ? above_mbmi : left_mbmi);
  } else {
    return 0;
  }
}